

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_setup_conn(Curl_easy *data,_Bool *protocol_done)

{
  connectdata *conn_00;
  connectdata *conn;
  CURLcode result;
  _Bool *protocol_done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  conn_00 = data->conn;
  Curl_pgrsTime(data,TIMER_NAMELOOKUP);
  if ((conn_00->handler->flags & 0x10) == 0) {
    if (((ulong)conn_00->bits >> 6 & 1) == 0) {
      conn._4_4_ = Curl_conn_setup(data,conn_00,0,conn_00->dns_entry,-1);
    }
    if (conn._4_4_ == CURLE_OK) {
      conn._4_4_ = Curl_headers_init(data);
    }
    *protocol_done = false;
    data_local._4_4_ = conn._4_4_;
  }
  else {
    *protocol_done = true;
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_setup_conn(struct Curl_easy *data,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }

  if(!conn->bits.reuse)
    result = Curl_conn_setup(data, conn, FIRSTSOCKET, conn->dns_entry,
                             CURL_CF_SSL_DEFAULT);
  if(!result)
    result = Curl_headers_init(data);

  /* not sure we need this flag to be passed around any more */
  *protocol_done = FALSE;
  return result;
}